

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_address_set_host_ip(ENetAddress *address,char *name)

{
  int iVar1;
  char *in_RSI;
  void *in_RDI;
  undefined4 local_4;
  
  iVar1 = inet_pton(2,in_RSI,in_RDI);
  if (iVar1 == 0) {
    local_4 = -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
enet_address_set_host_ip (ENetAddress * address, const char * name)
{
#ifdef HAS_INET_PTON
    if (! inet_pton (AF_INET, name, & address -> host))
#else
    if (! inet_aton (name, (struct in_addr *) & address -> host))
#endif
        return -1;

    return 0;
}